

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryPushNonJavascriptArray
              (ScriptContext *scriptContext,Var *args,uint argCount)

{
  uint64 *this;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  Type TVar5;
  uint32 uVar6;
  Var pvVar7;
  undefined4 *puVar8;
  RecyclableObject *this_00;
  ScriptContext *scriptContext_00;
  uint64 uVar9;
  uint64 uVar10;
  ulong uVar11;
  ScriptContext *pSVar12;
  long lVar13;
  ulong uVar14;
  double value;
  undefined1 auVar15 [16];
  undefined1 auStack_88 [8];
  BigIndex n;
  BigIndex big;
  JsReentLock jsReentLock;
  RecyclableObject *obj;
  
  big.bigIndex = (uint64)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)big.bigIndex)->noJsReentrancy;
  ((ThreadContext *)big.bigIndex)->noJsReentrancy = true;
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  BVar4 = JavascriptConversion::ToObject
                    (*args,scriptContext,(RecyclableObject **)&jsReentLock.m_savedNoJsReentrancy);
  if (BVar4 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.push");
  }
  JsReentLock::setObjectForMutation((JsReentLock *)&big.bigIndex,(Var)jsReentLock._24_8_);
  *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar7 = JavascriptOperators::OP_GetLength((Var)jsReentLock._24_8_,scriptContext);
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00b86d7d;
    *puVar8 = 0;
  }
  uVar11 = (ulong)pvVar7 & 0xffff000000000000;
  uVar14 = (ulong)pvVar7 & 0x1ffff00000000;
  if (uVar14 != 0x1000000000000 && uVar11 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b86d7d;
    *puVar8 = 0;
  }
  if ((ulong)pvVar7 >> 0x32 == 0 && uVar11 != 0x1000000000000) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00b86d7d;
      *puVar8 = 0;
    }
    TVar5 = ((this_00->type).ptr)->typeId;
    if (0x57 < (int)TVar5) {
      BVar4 = RecyclableObject::IsExternal(this_00);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00b86d7d;
        *puVar8 = 0;
      }
      goto LAB_00b8685f;
    }
  }
  else {
LAB_00b8685f:
    TVar5 = TypeIds_FirstNumberType;
  }
  if (((TVar5 != TypeIds_Undefined) ||
      ((scriptContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) ==
       DisableImplicitNoFlag)) ||
     (scriptContext->threadContext->implicitCallFlags == ImplicitCall_None)) {
    BigIndex::BigIndex((BigIndex *)auStack_88,0);
    if (((scriptContext->config).threadConfig)->m_ES6ToLength == true) {
      scriptContext_00 = (ScriptContext *)JavascriptConversion::ToLength(pvVar7,scriptContext);
      BigIndex::BigIndex((BigIndex *)&n.bigIndex,(uint64)scriptContext_00);
    }
    else {
      if (uVar14 != 0x1000000000000 && uVar11 == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00b86d7d;
        *puVar8 = 0;
      }
      if (uVar11 == 0x1000000000000) {
        if (uVar14 != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00b86d7d;
          *puVar8 = 0;
        }
      }
      else {
        uVar6 = JavascriptConversion::ToUInt32_Full(pvVar7,scriptContext);
        pvVar7 = (Var)(ulong)uVar6;
      }
      scriptContext_00 = (ScriptContext *)((ulong)pvVar7 & 0xffffffff);
      BigIndex::BigIndex((BigIndex *)&n.bigIndex,(uint32)pvVar7);
    }
    auStack_88 = (undefined1  [8])n.bigIndex;
    n.index = big.index;
    n._4_4_ = big._4_4_;
    uVar11 = 1;
    bVar2 = 1 < argCount;
    if (bVar2) {
      uVar11 = 1;
      this = &n.bigIndex;
      do {
        BigIndex::BigIndex((BigIndex *)this,0xffffffff);
        scriptContext_00 = (ScriptContext *)this;
        bVar3 = BigIndex::operator<((BigIndex *)auStack_88,(BigIndex *)this);
        pSVar12 = (ScriptContext *)jsReentLock._24_8_;
        if (!bVar3) break;
        *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar6 = BigIndex::GetSmallIndex((BigIndex *)auStack_88);
        BVar4 = JavascriptOperators::SetItem
                          (pSVar12,(RecyclableObject *)pSVar12,uVar6,args[uVar11],scriptContext,
                           PropertyOperation_ThrowIfNotExtensible,0);
        JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
        *(undefined1 *)(big.bigIndex + 0x108) = 1;
        if (BVar4 == 0) {
          bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
          if (bVar2) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
          }
          goto LAB_00b86d5b;
        }
        if (auStack_88._0_4_ == 0xffffffff) {
          n._0_8_ = n._0_8_ + 1;
        }
        else {
          auStack_88._0_4_ = auStack_88._0_4_ + 1;
        }
        uVar11 = uVar11 + 1;
        bVar2 = uVar11 < argCount;
        scriptContext_00 = pSVar12;
      } while (uVar11 != argCount);
    }
    if (bVar2) {
      n.bigIndex = (uint64)auStack_88;
      big.index = n.index;
      big._4_4_ = n._4_4_;
      if ((uint)uVar11 < argCount) {
        uVar11 = uVar11 & 0xffffffff;
        lVar13 = n._0_8_;
        uVar6 = auStack_88._0_4_;
        do {
          *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          scriptContext_00 = (ScriptContext *)jsReentLock._24_8_;
          BVar4 = BigIndex::SetItem((BigIndex *)&n.bigIndex,(RecyclableObject *)jsReentLock._24_8_,
                                    args[uVar11],PropertyOperation_ThrowIfNotExtensible);
          JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
          *(undefined1 *)(big.bigIndex + 0x108) = 1;
          if (BVar4 == 0) {
            bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
            if (bVar2) {
              JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
            }
            goto LAB_00b86d5b;
          }
          if (uVar6 == 0xffffffff) {
            lVar13 = lVar13 + 1;
            big._0_8_ = lVar13;
          }
          else {
            uVar6 = uVar6 + 1;
            n.bigIndex = CONCAT44(n.bigIndex._4_4_,uVar6);
          }
          uVar11 = uVar11 + 1;
        } while (argCount != uVar11);
      }
      pSVar12 = (ScriptContext *)jsReentLock._24_8_;
      *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar7 = BigIndex::ToNumber((BigIndex *)&n.bigIndex,scriptContext_00);
      BVar4 = JavascriptOperators::SetProperty
                        (pSVar12,(RecyclableObject *)pSVar12,0xd1,pvVar7,scriptContext,
                         PropertyOperation_ThrowIfNotExtensible);
      JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
      *(undefined1 *)(big.bigIndex + 0x108) = 1;
      if (BVar4 != 0) {
        pvVar7 = BigIndex::ToNumber((BigIndex *)&n.bigIndex,pSVar12);
        goto LAB_00b86d5e;
      }
      bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
      if (bVar2) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
      }
    }
    else {
      if (auStack_88._0_4_ == 0xffffffff) {
        uVar9 = BigIndex::GetBigIndex((BigIndex *)auStack_88);
      }
      else {
        uVar6 = BigIndex::GetSmallIndex((BigIndex *)auStack_88);
        uVar9 = (uint64)uVar6;
      }
      if (uVar9 < 0x80000000) {
        pvVar7 = (Var)(uVar9 | 0x1000000000000);
      }
      else {
        auVar15._8_4_ = (int)(uVar9 >> 0x20);
        auVar15._0_8_ = uVar9;
        auVar15._12_4_ = 0x45300000;
        value = ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0) +
                (auVar15._8_8_ - 1.9342813113834067e+25);
        uVar9 = NumberUtilities::ToSpecial(value);
        bVar2 = NumberUtilities::IsNan(value);
        if (bVar2) {
          uVar10 = NumberUtilities::ToSpecial(value);
          if (uVar10 != 0xfff8000000000000) {
            uVar10 = NumberUtilities::ToSpecial(value);
            if (uVar10 != 0x7ff8000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar2) {
LAB_00b86d7d:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar8 = 0;
            }
          }
        }
        pvVar7 = (Var)(uVar9 ^ 0xfffc000000000000);
      }
      *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar4 = JavascriptOperators::SetProperty
                        ((Var)jsReentLock._24_8_,(RecyclableObject *)jsReentLock._24_8_,0xd1,pvVar7,
                         scriptContext,PropertyOperation_ThrowIfNotExtensible);
      JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
      *(undefined1 *)(big.bigIndex + 0x108) = 1;
      if (BVar4 != 0) goto LAB_00b86d5e;
      bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
      if (bVar2) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
      }
    }
LAB_00b86d5b:
    pvVar7 = (Var)0x0;
  }
LAB_00b86d5e:
  *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar7;
}

Assistant:

Var JavascriptArray::EntryPushNonJavascriptArray(ScriptContext * scriptContext, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.push"));
        }
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        JS_REENTRANT_UNLOCK(jsReentLock, Var length = JavascriptOperators::OP_GetLength(obj, scriptContext));
        if(JavascriptOperators::GetTypeId(length) == TypeIds_Undefined && scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != Js::ImplicitCall_None)
        {
            return length;
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));
        BigIndex n;
        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
        {
            n = (uint64) JavascriptConversion::ToLength(length, scriptContext);
        }
        else
        {
            n = JavascriptConversion::ToUInt32(length, scriptContext);
        }
        // First handle "small" indices.
        uint index;
        for (index=1; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            JS_REENTRANT(jsReentLock,
                BOOL setItem = JavascriptOperators::SetItem(obj, obj, n.GetSmallIndex(), args[index], scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setItem))
            {
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            BigIndex big = n;

            for (; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, BOOL setItem = big.SetItem(obj, args[index], PropertyOperation_ThrowIfNotExtensible));
                if (h.IsThrowTypeError(setItem))
                {
                    if(scriptContext->GetThreadContext()->RecordImplicitException())
                    {
                        h.ThrowTypeErrorOnFailure();
                    }
                    else
                    {
                        return nullptr;
                    }
                }

            }

            // Set the new length; for objects it is all right for this to be >= MaxArrayLength
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, big.ToNumber(scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return big.ToNumber(scriptContext);
        }
        else
        {
            // Set the new length
            Var lengthAsNUmberVar = JavascriptNumber::ToVar(n.IsSmallIndex() ? n.GetSmallIndex() : n.GetBigIndex(), scriptContext);
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, lengthAsNUmberVar, scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return lengthAsNUmberVar;
        }
    }